

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_lib_module.cc
# Opt level: O0

PackedFunc * __thiscall
tvm::runtime::SystemLibModuleNode::GetFunction
          (PackedFunc *__return_storage_ptr__,SystemLibModuleNode *this,string *name,
          shared_ptr<tvm::runtime::ModuleNode> *sptr_to_self)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
  local_30;
  iterator it;
  shared_ptr<tvm::runtime::ModuleNode> *sptr_to_self_local;
  string *name_local;
  SystemLibModuleNode *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
               )sptr_to_self;
  if (this->module_blob_ != (void *)0x0) {
    ImportModuleBlob((char *)this->module_blob_,&(this->super_ModuleNode).imports_);
    this->module_blob_ = (void *)0x0;
  }
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
       ::find(&this->tbl_,name);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
       ::end(&this->tbl_);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_false,_true>
                           *)&local_30);
    WrapPackedFunc(__return_storage_ptr__,(BackendPackedCFunc)ppVar2->second,
                   (shared_ptr<tvm::runtime::ModuleNode> *)
                   it.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
                   ._M_cur);
  }
  else {
    PackedFunc::PackedFunc(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

PackedFunc GetFunction(
      const std::string &name,
      const std::shared_ptr<ModuleNode> &sptr_to_self) final {
    /* [RISCV-DLR] multi-threading is not supported, so lock is unnecessary */
    //std::lock_guard<std::mutex> lock(mutex_);

    if (module_blob_ != nullptr) {
      // If we previously recorded submodules, load them now.
      ImportModuleBlob(reinterpret_cast<const char *>(module_blob_), &imports_);
      module_blob_ = nullptr;
    }

    auto it = tbl_.find(name);
    if (it != tbl_.end()) {
      return WrapPackedFunc(
          reinterpret_cast<BackendPackedCFunc>(it->second), sptr_to_self);
      return PackedFunc();
    } else {
      return PackedFunc();
    }
  }